

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

uint __thiscall ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_OutlineFigure *this,ON_2fPoint *p)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint local_4c;
  ON_2fPoint candidate_p;
  ON_2fPoint prev_p;
  ON_2fPoint p0;
  
  if (p == (ON_2fPoint *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = 0;
    OVar2 = Internal_FigureEndDex(this,false);
    if (OVar2 != 0) {
      prev_p = ((this->m_points).m_a)->m_point;
      *p = prev_p;
      local_4c = 1;
      p0 = prev_p;
      if (3 < OVar2) {
        uVar5 = (ulong)((OVar2 >> 1) - 1);
        lVar6 = uVar5 * 0xc;
        while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
          bVar1 = ON_OutlineFigurePoint::IsOnFigure
                            ((ON_OutlineFigurePoint *)
                             (&((this->m_points).m_a)->m_point_type + lVar6));
          if (bVar1) {
            candidate_p = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar6);
            bVar1 = ON_2fPoint::operator!=(&prev_p,&candidate_p);
            if (bVar1) {
              prev_p = candidate_p;
              p[1] = candidate_p;
              local_4c = 2;
              break;
            }
          }
          lVar6 = lVar6 + -0xc;
        }
      }
      uVar5 = (ulong)OVar2;
      uVar7 = (ulong)(OVar2 >> 1);
      lVar6 = uVar7 * 0xc;
      for (; uVar7 <= uVar5; uVar7 = uVar7 + 1) {
        bVar1 = ON_OutlineFigurePoint::IsOnFigure
                          ((ON_OutlineFigurePoint *)(&((this->m_points).m_a)->m_point_type + lVar6))
        ;
        if (bVar1) {
          candidate_p = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar6);
          bVar1 = ON_2fPoint::operator!=(&prev_p,&candidate_p);
          if (bVar1) {
            prev_p = candidate_p;
            uVar3 = (ulong)local_4c;
            local_4c = local_4c + 1;
            p[uVar3] = candidate_p;
            break;
          }
        }
        lVar6 = lVar6 + 0xc;
      }
      lVar6 = uVar5 * 0xc;
      for (; (uVar7 & 0xffffffff) < uVar5; uVar5 = uVar5 - 1) {
        bVar1 = ON_OutlineFigurePoint::IsOnFigure
                          ((ON_OutlineFigurePoint *)(&((this->m_points).m_a)->m_point_type + lVar6))
        ;
        if (bVar1) {
          candidate_p = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar6);
          bVar1 = ON_2fPoint::operator!=(&prev_p,&candidate_p);
          if ((bVar1) && (bVar1 = ON_2fPoint::operator!=(&p0,&candidate_p), bVar1)) {
            uVar5 = (ulong)local_4c;
            local_4c = local_4c + 1;
            p[uVar5] = candidate_p;
            break;
          }
        }
        lVar6 = lVar6 + -0xc;
      }
    }
    for (uVar5 = (ulong)local_4c; uVar5 != 4; uVar5 = uVar5 + 1) {
      p[uVar5] = ON_2fPoint::NanPoint;
    }
  }
  return local_4c;
}

Assistant:

unsigned ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_2fPoint p[4]) const
{
  if (nullptr == p)
    return 0;
  
  unsigned point_count = 0;
  const ON__UINT32 end_dex = Internal_FigureEndDex(false);
  if (end_dex > 0)
  {
    // p[0] = point at the start
    const ON_2fPoint p0 = this->m_points[0].m_point;
    p[point_count++] = p0;


    // p[1] = point between start and middle
    ON_2fPoint prev_p = p0;
    unsigned i1 = end_dex / 2;
    if (i1 >= 2)
    {
      for (ON__UINT32 i = i1 - 1; i > 0; --i)
      {
        if (false == this->m_points[i].IsOnFigure())
          continue;
        const ON_2fPoint candidate_p = this->m_points[i].m_point;
        if (prev_p != candidate_p)
        {
          prev_p = candidate_p;
          p[point_count++] = candidate_p;
          break;
        }
      }
    }

    // p[2] = point between middle and end
    for (/*empty init*/; i1 <= end_dex; ++i1)
    {
      if (false == this->m_points[i1].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i1].m_point;
      if (prev_p != candidate_p)
      {
        prev_p = candidate_p;
        p[point_count++] = candidate_p;
        break;
      }
    }

    // p[3] = point close to end
    for (ON__UINT32 i = end_dex; i > i1; --i)
    {
      if (false == this->m_points[i].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i].m_point;
      if (prev_p != candidate_p && p0 != candidate_p)
      {
        p[point_count++] = candidate_p;
        break;
      }
    }
  }

  for (unsigned i = point_count; i < 4; ++i)
    p[i] = ON_2fPoint::NanPoint;
  return point_count;
}